

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

void Vec_IntSelectSortCostLit(Vec_Int_t *vSuper,Vec_Int_t *vCosts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_30;
  int t;
  int best_i;
  int j;
  int i;
  int nSize;
  int *pArray;
  Vec_Int_t *vCosts_local;
  Vec_Int_t *vSuper_local;
  
  piVar4 = Vec_IntArray(vSuper);
  iVar1 = Vec_IntSize(vSuper);
  for (best_i = 0; best_i < iVar1 + -1; best_i = best_i + 1) {
    local_30 = best_i;
    t = best_i;
    while (t = t + 1, t < iVar1) {
      iVar2 = Abc_Lit2Var(piVar4[t]);
      iVar2 = Vec_IntEntry(vCosts,iVar2);
      iVar3 = Abc_Lit2Var(piVar4[local_30]);
      iVar3 = Vec_IntEntry(vCosts,iVar3);
      if (iVar3 < iVar2) {
        local_30 = t;
      }
    }
    iVar2 = piVar4[best_i];
    piVar4[best_i] = piVar4[local_30];
    piVar4[local_30] = iVar2;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSortCostLit( Vec_Int_t * vSuper, Vec_Int_t * vCosts )
{
    int * pArray = Vec_IntArray(vSuper);
    int nSize = Vec_IntSize(vSuper);
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Vec_IntEntry(vCosts, Abc_Lit2Var(pArray[j])) > Vec_IntEntry(vCosts, Abc_Lit2Var(pArray[best_i])) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}